

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin2psf1.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char **ppcVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  char *strtol_endp;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tags;
  char region [256];
  char psf_path [4096];
  char *local_11a8;
  char *local_11a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1198;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1168;
  char local_1138 [256];
  char local_1038 [4];
  undefined1 auStack_1034 [4100];
  
  memset(local_1038,0,0x1000);
  memset(local_1138,0,0x100);
  iVar12 = 1;
  if (1 < argc) {
    iVar12 = 1;
    do {
      pcVar2 = argv[iVar12];
      if (*pcVar2 != '-') break;
      iVar4 = strcmp(pcVar2,"--help");
      if (iVar4 == 0) {
        printUsage(*argv);
        return 0;
      }
      if (((pcVar2[1] == 'o') && (pcVar2[2] == '\0')) ||
         (iVar4 = strcmp(pcVar2,"--out-filename"), iVar4 == 0)) {
        pcVar5 = local_1038;
      }
      else {
        if (((pcVar2[1] != 'r') || (pcVar2[2] != '\0')) &&
           (iVar4 = strcmp(pcVar2,"--region"), iVar4 != 0)) {
          pcVar5 = "Error: Unknown option \"%s\"\n";
          goto LAB_00104da6;
        }
        pcVar5 = local_1138;
      }
      if (argc <= iVar12 + 1) {
        pcVar5 = "Error: Too few arguments for \"%s\".\n";
LAB_00104da6:
        fprintf(_stderr,pcVar5,pcVar2);
        return 1;
      }
      strcpy(pcVar5,argv[iVar12 + 1]);
      iVar12 = iVar12 + 2;
    } while (iVar12 < argc);
  }
  if (argc - iVar12 == 4) {
    ppcVar1 = argv + iVar12;
    pcVar2 = *ppcVar1;
    if (local_1038[0] == '\0') {
      strcpy(local_1038,pcVar2);
      pcVar5 = strrchr(local_1038,0x2e);
      pcVar6 = strrchr(local_1038,0x2f);
      if (pcVar5 <= pcVar6) {
        sVar7 = strlen(local_1038);
        pcVar5 = local_1038 + sVar7;
      }
      *pcVar5 = '\0';
      sVar7 = strlen(local_1038);
      auStack_1034[sVar7] = 0;
      builtin_strncpy(local_1038 + sVar7,".psf",4);
    }
    uVar8 = strtoul(ppcVar1[1],&local_11a8,0x10);
    if ((*local_11a8 == '\0') && (piVar9 = __errno_location(), *piVar9 != 0x22)) {
      local_11a0 = pcVar2;
      uVar10 = strtoul(ppcVar1[2],&local_11a8,0x10);
      if ((*local_11a8 == '\0') && (*piVar9 != 0x22)) {
        uVar11 = strtoul(ppcVar1[3],&local_11a8,0x10);
        if ((*local_11a8 == '\0') && (*piVar9 != 0x22)) {
          local_1198._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_1198._M_impl.super__Rb_tree_header._M_header;
          local_1198._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_1198._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_1198._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_1198._M_impl.super__Rb_tree_header._M_header._M_right =
               local_1198._M_impl.super__Rb_tree_header._M_header._M_left;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_Rb_tree(&local_1168,&local_1198);
          bVar3 = bin2psf1(local_11a0,local_1038,(uint32_t)uVar8,(uint32_t)uVar10,(uint32_t)uVar11,
                           local_1138,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_1168);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_1168);
          if (!bVar3) {
            main_cold_2();
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_1198);
          return (uint)!bVar3;
        }
        main_cold_3();
      }
      else {
        main_cold_4();
      }
    }
    else {
      main_cold_5();
    }
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
	int argnum;
	int argi;

	unsigned long ulvalue;
	char * strtol_endp;

	char psf_path[PATH_MAX] = { '\0' };

	char region[256] = { '\0' };

	argi = 1;
	while (argi < argc && argv[argi][0] == '-') {
		if (strcmp(argv[argi], "--help") == 0) {
			printUsage(argv[0]);
			return EXIT_SUCCESS;
		}
		else if (strcmp(argv[argi], "-o") == 0 || strcmp(argv[argi], "--out-filename") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\".\n", argv[argi]);
				return EXIT_FAILURE;
			}
			strcpy(psf_path, argv[argi + 1]);
			argi++;
		}
		else if (strcmp(argv[argi], "-r") == 0 || strcmp(argv[argi], "--region") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\".\n", argv[argi]);
				return EXIT_FAILURE;
			}
			strcpy(region, argv[argi + 1]);
			argi++;
		}
		else {
			fprintf(stderr, "Error: Unknown option \"%s\"\n", argv[argi]);
			return EXIT_FAILURE;
		}
		argi++;
	}

	argnum = argc - argi;
	if (argnum != 4) {
		fprintf(stderr, "Error: Too few/more arguments.\n");
		fprintf(stderr, "\n");
		fprintf(stderr, "Run \"%s --help\" for help.\n", argv[0]);
		return EXIT_FAILURE;
	}

	char * bin_path = argv[argi];

	if (psf_path[0] == '\0') {
		strcpy(psf_path, bin_path);
		path_stripext(psf_path);
		strcat(psf_path, ".psf");
	}

	ulvalue = strtoul(argv[argi + 1], &strtol_endp, 16);
	if (*strtol_endp != '\0' || errno == ERANGE) {
		fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 1]);
		return EXIT_FAILURE;
	}
	uint32_t load_address = ulvalue;

	ulvalue = strtoul(argv[argi + 2], &strtol_endp, 16);
	if (*strtol_endp != '\0' || errno == ERANGE) {
		fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 2]);
		return EXIT_FAILURE;
	}
	uint32_t initial_pc = ulvalue;

	ulvalue = strtoul(argv[argi + 3], &strtol_endp, 16);
	if (*strtol_endp != '\0' || errno == ERANGE) {
		fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 3]);
		return EXIT_FAILURE;
	}
	uint32_t initial_sp = ulvalue;

	std::map<std::string, std::string> tags;
	if (!bin2psf1(bin_path, psf_path, load_address, initial_pc, initial_sp, region, tags)) {
		fprintf(stderr, "Error: Unable to convert to PSF1 format\n");
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}